

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O3

vector<Vector3<double>,_std::allocator<Vector3<double>_>_> * __thiscall
s2coding::EncodedS2PointVector::Decode
          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__return_storage_ptr__,
          EncodedS2PointVector *this)

{
  pointer *ppVVar1;
  VType *pVVar2;
  char *pcVar3;
  iterator __position;
  ulong uVar4;
  long lVar5;
  S2Point local_58;
  S2LogMessage local_38;
  
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (__return_storage_ptr__,(ulong)this->size_);
  if (this->size_ != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (this->format_ == CELL_IDS) {
        DecodeCellIdsFormat(&local_58,this,(int)uVar4);
      }
      else {
        if (this->format_ != UNCOMPRESSED) {
          S2LogMessage::S2LogMessage
                    (&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.h"
                     ,0x85,kFatal,(ostream *)&std::cerr);
          std::operator<<(local_38.stream_,"Unrecognized format");
          abort();
        }
        pcVar3 = (this->field_2).cell_ids_.blocks.offsets_.data_;
        local_58.c_[2] = *(VType *)(pcVar3 + lVar5 + 0x10);
        pVVar2 = (VType *)(pcVar3 + lVar5);
        local_58.c_[0] = *pVVar2;
        local_58.c_[1] = pVVar2[1];
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)__return_storage_ptr__
                   ,__position,&local_58);
      }
      else {
        (__position._M_current)->c_[2] = local_58.c_[2];
        (__position._M_current)->c_[0] = local_58.c_[0];
        (__position._M_current)->c_[1] = local_58.c_[1];
        ppVVar1 = &(__return_storage_ptr__->
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < this->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Point> EncodedS2PointVector::Decode() const {
  vector<S2Point> points;
  points.reserve(size_);
  for (int i = 0; i < size_; ++i) {
    points.push_back((*this)[i]);
  }
  return points;
}